

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02_signal_restart.c
# Opt level: O2

int main(void)

{
  int iVar1;
  ssize_t sVar2;
  char *__s;
  sigaction sa;
  char buff [1024];
  
  sigemptyset((sigset_t *)&sa.sa_mask);
  sa.sa_flags = 0x10000000;
  sa.__sigaction_handler.sa_handler = sigalrm_handler;
  iVar1 = sigaction(0xe,(sigaction *)&sa,(sigaction *)0x0);
  if (iVar1 == -1) {
    __s = "sigaction";
  }
  else {
    alarm(5);
    do {
      memset(buff,0,0x400);
      sVar2 = read(0,buff,0x3ff);
      if (sVar2 == -1) {
        __s = "read";
        goto LAB_0010126c;
      }
      sVar2 = write(1,buff,0x400);
    } while (sVar2 != -1);
    __s = "write";
  }
LAB_0010126c:
  perror(__s);
  exit(1);
}

Assistant:

int main() {
    struct sigaction sa;
    char buff[1024];

    /*
     * Setup a signal handler for the SIGALRM signal
     * */
    sigemptyset(&sa.sa_mask);
    sa.sa_flags = SA_RESTART;
    sa.sa_handler = sigalrm_handler;
    if (sigaction(SIGALRM, &sa, NULL) == -1)
        handle_error("sigaction");

    /*
     * Let's send ourselves a SIGALRM signal a few
     * seconds later.
     * */
    alarm(ALARM_AFTER_SECS);

    /*
     * Infinite loop where we read from stdin and print
     * what we read back to stdout.
     * */
    while(1) {
        bzero(buff, sizeof(buff));
        if( read(STDIN_FILENO, buff, sizeof(buff)-1 ) == -1 )
            handle_error("read");
        if( write(STDOUT_FILENO, buff, sizeof(buff) ) == -1 )
            handle_error("write");
    }

    return 0;
}